

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeConfig.cpp
# Opt level: O2

string * anon_unknown.dwarf_2ef27::config_var_name
                   (string *__return_storage_ptr__,string *name,string *key)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  size_type sVar4;
  allocator<char> local_a2;
  allocator<char> local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"CALI_",&local_a1);
  std::operator+(&local_80,&local_40,name);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"_",&local_a2);
  std::operator+(&local_60,&local_80,&local_a0);
  std::operator+(__return_storage_ptr__,&local_60,key);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  sVar2 = __return_storage_ptr__->_M_string_length;
  for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
    iVar3 = toupper((int)pcVar1[sVar4]);
    pcVar1[sVar4] = (char)iVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string config_var_name(const std::string& name, const std::string& key)
{
    // make uppercase PREFIX_NAMESPACE_KEY string

    std::string str = std::string("CALI_") + name + std::string("_") + key;
    std::transform(str.begin(), str.end(), str.begin(), ::toupper);

    return str;
}